

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add127_test.cc
# Opt level: O1

void intgemm::anon_unknown_0::TestPrepareA<intgemm::SSSE3::Kernels8>(Index rows,Index cols)

{
  float *pfVar1;
  size_t __i;
  long lVar2;
  ulong uVar3;
  float fVar4;
  AlignedVector<float> inputA;
  AlignedVector<unsigned_char> newA;
  AlignedVector<signed_char> oldA;
  mt19937 gen;
  AlignedVector<float> local_13e8;
  AlignedVector<unsigned_char> local_13d8;
  AlignedVector<signed_char> local_13c8;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  local_13b8._M_x[0] = 0x1571;
  lVar2 = 1;
  uVar3 = 0x1571;
  do {
    uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar2);
    local_13b8._M_x[lVar2] = uVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x270);
  local_13b8._M_p = 0x270;
  uVar3 = (ulong)(cols * rows);
  AlignedVector<float>::AlignedVector(&local_13e8,uVar3,0x40);
  pfVar1 = local_13e8.mem_;
  if (local_13e8.size_ != 0) {
    lVar2 = 0;
    do {
      fVar4 = std::
              generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        (&local_13b8);
      *(float *)((long)pfVar1 + lVar2) = fVar4 * 4.0 + -2.0;
      lVar2 = lVar2 + 4;
    } while (local_13e8.size_ << 2 != lVar2);
  }
  AlignedVector<signed_char>::AlignedVector(&local_13c8,uVar3,0x40);
  AlignedVector<unsigned_char>::AlignedVector(&local_13d8,uVar3,0x40);
  SSSE3::Kernels8::PrepareA(local_13e8.mem_,local_13c8.mem_,64.0,rows,cols);
  SSSE3::Kernels8::PrepareA(local_13e8.mem_,local_13d8.mem_,64.0,rows,cols);
  CompareAs(local_13c8.mem_,local_13d8.mem_,rows,cols);
  free(local_13d8.mem_);
  free(local_13c8.mem_);
  free(local_13e8.mem_);
  return;
}

Assistant:

void TestPrepareA(Index rows, Index cols) {
  std::mt19937 gen;
  // Go somewhat out of range too.
  std::uniform_real_distribution<float> dist(-2, 2);
  // Create array.
  AlignedVector<float> inputA(rows * cols);
  for (auto& it : inputA) {
    it = dist(gen);
  }
  AlignedVector<int8_t> oldA(rows * cols);
  AlignedVector<uint8_t> newA(rows * cols);
  float quant_mult = 64; //From example
  Routine::PrepareA(inputA.begin(), oldA.begin(), quant_mult, rows, cols);
  Routine::PrepareA(inputA.begin(), newA.begin(), quant_mult, rows, cols);
  CompareAs(oldA.begin(), newA.begin(), rows, cols);
}